

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

uint64_t __thiscall rcg::Device::getTimestampFrequency(Device *this)

{
  PIFGetDeviceInfo p_Var1;
  uint64_t uVar2;
  void *pvVar3;
  uint64_t freq;
  INFO_DATATYPE type;
  size_t size;
  __shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::mutex::lock(&this->mtx);
  freq = 0;
  size = 8;
  if (this->dev == (DEV_HANDLE)0x0) {
    pvVar3 = Interface::getHandle
                       ((this->parent).
                        super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (pvVar3 != (void *)0x0) {
      p_Var1 = ((this->gentl).
                super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               IFGetDeviceInfo;
      std::__shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_30,
                 &(this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>);
      pvVar3 = Interface::getHandle(local_30._M_ptr);
      (*p_Var1)(pvVar3,(this->id)._M_dataplus._M_p,9,&type,&freq,&size);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    }
  }
  else {
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->DevGetInfo)(this->dev,9,&type,&freq,&size);
  }
  uVar2 = freq;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return uVar2;
}

Assistant:

uint64_t Device::getTimestampFrequency()
{
  std::lock_guard<std::mutex> lock(mtx);
  GenTL::INFO_DATATYPE type;
  uint64_t freq=0;
  size_t size=sizeof(freq);

  if (dev != 0)
  {
    gentl->DevGetInfo(dev, GenTL::DEVICE_INFO_TIMESTAMP_FREQUENCY, &type, &freq, &size);
  }
  else if (parent->getHandle() != 0)
  {
    gentl->IFGetDeviceInfo(getParent()->getHandle(), id.c_str(),
                           GenTL::DEVICE_INFO_TIMESTAMP_FREQUENCY, &type, &freq, &size);
  }

  return freq;
}